

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

MIR_reg_t add_ld_st(gen_ctx_t gen_ctx,MIR_op_t *mem_op,MIR_reg_t loc,MIR_reg_t base_reg,
                   MIR_op_mode_t data_mode,MIR_reg_t hard_reg,int st_p,MIR_reg_t temp_hard_reg,
                   MIR_insn_t anchor,int after_p)

{
  MIR_context_t ctx;
  FILE *pFVar1;
  bb_insn_t_conflict before;
  uint uVar2;
  MIR_disp_t MVar3;
  MIR_insn_t_conflict insn;
  bb_t_conflict bb;
  bb_insn_t_conflict elem;
  char *pcVar4;
  MIR_type_t type;
  MIR_insn_code_t code;
  DLIST_bb_insn_t *list;
  bool bVar5;
  MIR_op_t local_68;
  
  if (temp_hard_reg != 0xffffffff) {
    ctx = gen_ctx->ctx;
    bVar5 = data_mode - MIR_OP_FLOAT < 3;
    type = MIR_T_I64;
    if (bVar5) {
      type = data_mode + MIR_OP_INT;
    }
    code = MIR_MOV;
    if (bVar5) {
      code = data_mode - MIR_OP_UINT;
    }
    if (hard_reg == 0xffffffff) {
      MVar3 = target_get_stack_slot_offset(gen_ctx,type,loc - 0x22);
      _MIR_new_var_mem_op(&local_68,ctx,type,MVar3,base_reg,0xffffffff,'\0');
      (mem_op->u).i = local_68.u.i;
      (mem_op->u).str.s = local_68.u.str.s;
      *(undefined8 *)((long)&mem_op->u + 0x10) = local_68.u._16_8_;
      (mem_op->u).mem.disp = local_68.u.mem.disp;
      mem_op->data = local_68.data;
      *(undefined8 *)&mem_op->field_0x8 = local_68._8_8_;
      (mem_op->u).i = local_68.u.i;
      (mem_op->u).str.s = local_68.u.str.s;
    }
    else {
      setup_used_hard_regs(gen_ctx,type,hard_reg);
      MVar3 = target_get_stack_slot_offset(gen_ctx,type,loc - 0x22);
      _MIR_new_var_mem_op(&local_68,ctx,type,MVar3,base_reg,0xffffffff,'\0');
      (mem_op->u).i = local_68.u.i;
      (mem_op->u).str.s = local_68.u.str.s;
      *(undefined8 *)((long)&mem_op->u + 0x10) = local_68.u._16_8_;
      (mem_op->u).mem.disp = local_68.u.mem.disp;
      mem_op->data = local_68.data;
      *(undefined8 *)&mem_op->field_0x8 = local_68._8_8_;
      (mem_op->u).i = local_68.u.i;
      (mem_op->u).str.s = local_68.u.str.s;
      _MIR_new_var_op(ctx,hard_reg);
      insn = MIR_new_insn(ctx,code);
      pFVar1 = (FILE *)gen_ctx->debug_file;
      if ((pFVar1 != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        bb = get_insn_bb(gen_ctx,anchor);
        pcVar4 = "after";
        if (after_p == 0) {
          pcVar4 = "before";
        }
        fprintf(pFVar1,"    Adding %s insn ",pcVar4);
        fprintf((FILE *)gen_ctx->debug_file," (in BB %lu",bb->index);
        if ((gen_ctx->optimize_level == 0) || (bb->loop_node == (loop_node_t_conflict)0x0)) {
          fwrite(") ",2,1,(FILE *)gen_ctx->debug_file);
        }
        else {
          pFVar1 = (FILE *)gen_ctx->debug_file;
          uVar2 = bb_loop_level(bb);
          fprintf(pFVar1,", level %d) ",(ulong)uVar2);
        }
        MIR_output_insn(ctx,gen_ctx->debug_file,anchor,(gen_ctx->curr_func_item->u).func,0);
        fwrite(":\n",2,1,(FILE *)gen_ctx->debug_file);
        fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
        MIR_output_insn(ctx,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
      }
      if (after_p == 0) {
        MIR_insert_insn_before(ctx,gen_ctx->curr_func_item,anchor,insn);
      }
      else {
        MIR_insert_insn_after(ctx,gen_ctx->curr_func_item,anchor,insn);
      }
      if (gen_ctx->optimize_level == 0) {
        uVar2 = *(int *)&anchor->field_0x18 - 0xa7;
        if ((uVar2 < 0xe) && ((0x2007U >> (uVar2 & 0x1f) & 1) != 0)) {
          anchor = (MIR_insn_t)anchor->data;
        }
        insn->data = anchor->data;
      }
      else {
        before = (bb_insn_t_conflict)anchor->data;
        elem = create_bb_insn(gen_ctx,insn,before->bb);
        list = &before->bb->bb_insns;
        if (after_p == 0) {
          DLIST_bb_insn_t_insert_before(list,before,elem);
        }
        else {
          DLIST_bb_insn_t_insert_after(list,before,elem);
        }
      }
    }
    return hard_reg;
  }
  __assert_fail("temp_hard_reg != (4294967295U)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e15,
                "MIR_reg_t add_ld_st(gen_ctx_t, MIR_op_t *, MIR_reg_t, MIR_reg_t, MIR_op_mode_t, MIR_reg_t, int, MIR_reg_t, MIR_insn_t, int)"
               );
}

Assistant:

static MIR_reg_t add_ld_st (gen_ctx_t gen_ctx, MIR_op_t *mem_op, MIR_reg_t loc, MIR_reg_t base_reg,
                            MIR_op_mode_t data_mode, MIR_reg_t hard_reg, int st_p,
                            MIR_reg_t temp_hard_reg, MIR_insn_t anchor, int after_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_disp_t offset;
  MIR_insn_code_t code;
  MIR_insn_t new_insn, new_insns[3];
  MIR_type_t type;
  bb_insn_t bb_insn, new_bb_insn;
  MIR_op_t hard_reg_op;
  size_t n;

  gen_assert (temp_hard_reg != MIR_NON_VAR);
  type = mode2type (data_mode);
  code = (type == MIR_T_I64 ? MIR_MOV
          : type == MIR_T_F ? MIR_FMOV
          : type == MIR_T_D ? MIR_DMOV
                            : MIR_LDMOV);
  if (hard_reg != MIR_NON_VAR) setup_used_hard_regs (gen_ctx, type, hard_reg);
  offset = target_get_stack_slot_offset (gen_ctx, type, loc - MAX_HARD_REG - 1);
  n = 0;
  if (target_valid_mem_offset_p (gen_ctx, type, offset)) {
    *mem_op = _MIR_new_var_mem_op (ctx, type, offset, base_reg, MIR_NON_VAR, 0);
  } else {
    new_insns[0] = MIR_new_insn (ctx, MIR_MOV, _MIR_new_var_op (ctx, temp_hard_reg),
                                 MIR_new_int_op (ctx, offset));
    new_insns[1]
      = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, temp_hard_reg),
                      _MIR_new_var_op (ctx, temp_hard_reg), _MIR_new_var_op (ctx, base_reg));
    n = 2;
    *mem_op = _MIR_new_var_mem_op (ctx, type, 0, temp_hard_reg, MIR_NON_VAR, 0);
  }
  if (hard_reg == MIR_NON_VAR) return hard_reg; /* LD vars can be always kept in memory */
  hard_reg_op = _MIR_new_var_op (ctx, hard_reg);
  if (!st_p) {
    new_insns[n++] = MIR_new_insn (ctx, code, hard_reg_op, *mem_op);
  } else {
    new_insns[n++] = MIR_new_insn (ctx, code, *mem_op, hard_reg_op);
  }
  DEBUG (2, {
    bb_t bb = get_insn_bb (gen_ctx, anchor);
    fprintf (debug_file, "    Adding %s insn ", after_p ? "after" : "before");
    fprintf (debug_file, " (in BB %lu", (unsigned long) bb->index);
    if (optimize_level == 0 || bb->loop_node == NULL)
      fprintf (debug_file, ") ");
    else
      fprintf (debug_file, ", level %d) ", bb_loop_level (bb));
    MIR_output_insn (ctx, debug_file, anchor, curr_func_item->u.func, FALSE);
    fprintf (debug_file, ":\n");
    for (size_t i = 0; i < n; i++) {
      fprintf (debug_file, "      ");
      MIR_output_insn (ctx, debug_file, new_insns[i], curr_func_item->u.func, TRUE);
    }
  });
  if (after_p) {
    for (size_t i = 0, j = n - 1; i < j; i++, j--) { /* reverse for subsequent correct insertion: */
      new_insn = new_insns[i];
      new_insns[i] = new_insns[j];
      new_insns[j] = new_insn;
    }
  }
  for (size_t i = 0; i < n; i++) {
    new_insn = new_insns[i];
    if (after_p)
      MIR_insert_insn_after (ctx, curr_func_item, anchor, new_insn);
    else
      MIR_insert_insn_before (ctx, curr_func_item, anchor, new_insn);
    if (optimize_level == 0) {
      new_insn->data = get_insn_data_bb (anchor);
    } else {
      bb_insn = anchor->data;
      new_bb_insn = create_bb_insn (gen_ctx, new_insn, bb_insn->bb);
      if (after_p)
        DLIST_INSERT_AFTER (bb_insn_t, bb_insn->bb->bb_insns, bb_insn, new_bb_insn);
      else
        DLIST_INSERT_BEFORE (bb_insn_t, bb_insn->bb->bb_insns, bb_insn, new_bb_insn);
    }
  }
  return hard_reg;
}